

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

invalid_iterator *
nlohmann::detail::invalid_iterator::create
          (invalid_iterator *__return_storage_ptr__,int id_,string *what_arg)

{
  char *what_arg_00;
  allocator<char> local_81;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string w;
  string *what_arg_local;
  int id__local;
  
  w.field_2._8_8_ = what_arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"invalid_iterator",&local_81);
  exception::name(&local_60,&local_80,id_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 w.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  what_arg_00 = (char *)std::__cxx11::string::c_str();
  invalid_iterator(__return_storage_ptr__,id_,what_arg_00);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static invalid_iterator create(int id_, const std::string& what_arg)
    {
        std::string w = exception::name("invalid_iterator", id_) + what_arg;
        return invalid_iterator(id_, w.c_str());
    }